

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O1

void borg_count_death(wchar_t i)

{
  _Bool _Var1;
  borg_kill *pbVar2;
  ulong uVar3;
  
  uVar3 = (ulong)borg_kills[i].r_idx;
  if (uVar3 != 0) {
    pbVar2 = borg_kills + i;
    if (borg_race_death[uVar3] != 0x7fff) {
      borg_race_death[uVar3] = borg_race_death[uVar3] + 1;
    }
    _Var1 = flag_has_dbg(r_info[pbVar2->r_idx].flags,0xb,1,"r_info[kill->r_idx].flags","RF_UNIQUE");
    if (_Var1) {
      unique_on_level = 0;
    }
  }
  return;
}

Assistant:

void borg_count_death(int i)
{
    borg_kill *kill = &borg_kills[i];

    if (kill->r_idx) {
        /* Hack -- count racial deaths */
        if (borg_race_death[kill->r_idx] < SHRT_MAX)
            borg_race_death[kill->r_idx]++;

        /* if it was a unique then remove the unique_on_level flag */
        if (rf_has(r_info[kill->r_idx].flags, RF_UNIQUE))
            unique_on_level = 0;
    }
}